

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O0

void __thiscall dmlc::JSONWriter::WriteString(JSONWriter *this,string *s)

{
  char item;
  ulong uVar1;
  char *pcVar2;
  ulong uStack_20;
  char ch;
  size_t i;
  string *s_local;
  JSONWriter *this_local;
  
  anon_unknown_9::Extend<char>(this->os_,'\"');
  uStack_20 = 0;
  while( true ) {
    uVar1 = std::__cxx11::string::length();
    if (uVar1 <= uStack_20) break;
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)s);
    item = *pcVar2;
    if (item == '\t') {
      (anonymous_namespace)::Extend<char_const*>(this->os_,"\\t");
    }
    else if (item == '\n') {
      (anonymous_namespace)::Extend<char_const*>(this->os_,"\\n");
    }
    else if (item == '\r') {
      (anonymous_namespace)::Extend<char_const*>(this->os_,"\\r");
    }
    else if (item == '\"') {
      (anonymous_namespace)::Extend<char_const*>(this->os_,"\\\"");
    }
    else if (item == '\\') {
      (anonymous_namespace)::Extend<char_const*>(this->os_,"\\\\");
    }
    else {
      anon_unknown_9::Extend<char>(this->os_,item);
    }
    uStack_20 = uStack_20 + 1;
  }
  anon_unknown_9::Extend<char>(this->os_,'\"');
  return;
}

Assistant:

inline void JSONWriter::WriteString(const std::string &s) {
  Extend(os_, '\"');
  for (size_t i = 0; i < s.length(); ++i) {
    char ch = s[i];
    switch (ch) {
    case '\r':
      Extend(os_, "\\r");
      break;
    case '\n':
      Extend(os_, "\\n");
      break;
    case '\\':
      Extend(os_, "\\\\");
      break;
    case '\t':
      Extend(os_, "\\t");
      break;
    case '\"':
      Extend(os_, "\\\"");
      break;
    default:
      Extend(os_, ch);
    }
  }
  Extend(os_, '\"');
}